

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureCompressedFormatTests.cpp
# Opt level: O3

void vkt::texture::anon_unknown_1::populateTextureCompressedFormatTests
               (TestCaseGroup *compressedTextureTests)

{
  VkFormat VVar1;
  TestNode *node;
  long *plVar2;
  undefined8 uVar3;
  long *plVar4;
  long lVar5;
  string nameBase;
  string formatStr;
  allocator<char> local_2a6;
  allocator<char> local_2a5;
  uint local_2a4;
  long *local_2a0 [2];
  long local_290 [2];
  long *local_280 [2];
  long local_270 [2];
  size_type *local_260;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  string local_238;
  Program local_218;
  undefined4 uStack_214;
  long local_208 [2];
  long *local_1f8;
  long local_1f0;
  long local_1e8 [2];
  TestNode *local_1d8;
  TestContext *local_1d0;
  long *local_1c8 [2];
  long local_1b8 [2];
  _func_int **local_1a8;
  FilterMode FStack_1a0;
  FilterMode FStack_19c;
  WrapMode local_198;
  WrapMode WStack_194;
  VkFormat local_190;
  vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_> local_188;
  size_type local_170;
  ios_base local_138 [264];
  
  local_1d0 = (compressedTextureTests->super_TestNode).m_testCtx;
  uVar3 = CONCAT71((int7)((ulong)local_1d0 >> 8),1);
  lVar5 = 0;
  local_1d8 = &compressedTextureTests->super_TestNode;
  do {
    local_2a4 = (uint)uVar3;
    local_260 = &DAT_00d040e0 + lVar5 * 2;
    lVar5 = 0;
    do {
      VVar1 = *(VkFormat *)((long)&DAT_00b29ec0 + lVar5);
      local_238._M_dataplus._M_p = (pointer)::vk::getFormatName;
      local_238._M_string_length._0_4_ = VVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      tcu::Format::Enum<vk::VkFormat,_4UL>::toStream
                ((Enum<vk::VkFormat,_4UL> *)&local_238,(ostream *)&local_1a8);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_1f8);
      de::toLower(&local_238,(string *)&local_1a8);
      if (local_1a8 != (_func_int **)&local_198) {
        operator_delete(local_1a8,CONCAT44(WStack_194,local_198) + 1);
      }
      util::Texture2DTestCaseParameters::Texture2DTestCaseParameters
                ((Texture2DTestCaseParameters *)&local_1a8);
      local_170 = *local_260;
      FStack_1a0 = NEAREST;
      FStack_19c = NEAREST;
      local_218 = PROGRAM_2D_FLOAT;
      local_190 = VVar1;
      if (local_188.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_188.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        _M_realloc_insert<vkt::texture::util::Program>
                  (&local_188,
                   (iterator)
                   local_188.
                   super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_218);
      }
      else {
        *local_188.
         super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
         ._M_impl.super__Vector_impl_data._M_finish = PROGRAM_2D_FLOAT;
        local_188.
        super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_188.
             super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      node = (TestNode *)operator_new(0xb0);
      local_2a0[0] = local_290;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_2a0,local_238._M_dataplus._M_p,
                 local_238._M_dataplus._M_p +
                 CONCAT44(local_238._M_string_length._4_4_,(VkFormat)local_238._M_string_length));
      std::__cxx11::string::append((char *)local_2a0);
      plVar2 = (long *)std::__cxx11::string::append((char *)local_2a0);
      local_258 = &local_248;
      plVar4 = plVar2 + 2;
      if ((long *)*plVar2 == plVar4) {
        local_248 = *plVar4;
        lStack_240 = plVar2[3];
      }
      else {
        local_248 = *plVar4;
        local_258 = (long *)*plVar2;
      }
      local_250 = plVar2[1];
      *plVar2 = (long)plVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_218,(char *)local_258,&local_2a5);
      local_280[0] = local_270;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_280,local_1f8,local_1f0 + (long)local_1f8);
      std::__cxx11::string::append((char *)local_280);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1c8,(char *)local_280[0],&local_2a6);
      tcu::TestCase::TestCase
                ((TestCase *)node,local_1d0,(char *)CONCAT44(uStack_214,local_218),
                 (char *)local_1c8[0]);
      node->_vptr_TestNode = (_func_int **)&PTR__TextureTestCase_00d04110;
      node[1]._vptr_TestNode = local_1a8;
      node[1].m_testCtx = (TestContext *)CONCAT44(FStack_19c,FStack_1a0);
      *(ulong *)((long)&node[1].m_testCtx + 4) = CONCAT44(local_198,FStack_19c);
      *(ulong *)((long)&node[1].m_name._M_dataplus._M_p + 4) = CONCAT44(local_190,WStack_194);
      std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::vector
                ((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                  *)&node[1].m_name.field_2,&local_188);
      node[1].m_description._M_string_length = local_170;
      tcu::TestNode::addChild(local_1d8,node);
      if (local_1c8[0] != local_1b8) {
        operator_delete(local_1c8[0],local_1b8[0] + 1);
      }
      if (local_280[0] != local_270) {
        operator_delete(local_280[0],local_270[0] + 1);
      }
      if ((long *)CONCAT44(uStack_214,local_218) != local_208) {
        operator_delete((long *)CONCAT44(uStack_214,local_218),local_208[0] + 1);
      }
      if (local_258 != &local_248) {
        operator_delete(local_258,local_248 + 1);
      }
      if (local_2a0[0] != local_290) {
        operator_delete(local_2a0[0],local_290[0] + 1);
      }
      if (local_188.
          super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_188.
                        super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_188.
                              super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_188.
                              super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if (local_1f8 != local_1e8) {
        operator_delete(local_1f8,local_1e8[0] + 1);
      }
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x28);
    lVar5 = 1;
    uVar3 = 0;
  } while ((local_2a4 & 1) != 0);
  return;
}

Assistant:

void populateTextureCompressedFormatTests (tcu::TestCaseGroup* compressedTextureTests)
{
	tcu::TestContext&	testCtx	= compressedTextureTests->getTestContext();

	// ETC2 and EAC compressed formats.
	const struct {
		const VkFormat	format;
	} etc2Formats[] =
	{
		{ VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK		},
		{ VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK		},
		{ VK_FORMAT_ETC2_R8G8B8A1_UNORM_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A1_SRGB_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK	},
		{ VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK	},

		{ VK_FORMAT_EAC_R11_UNORM_BLOCK			},
		{ VK_FORMAT_EAC_R11_SNORM_BLOCK			},
		{ VK_FORMAT_EAC_R11G11_UNORM_BLOCK		},
		{ VK_FORMAT_EAC_R11G11_SNORM_BLOCK		},
	};

	const struct {
		const int	width;
		const int	height;
		const char*	name;
	} sizes[] =
	{
		{ 128, 64, "pot"  },
		{ 51,  65, "npot" },
	};

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(sizes); sizeNdx++)
	for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(etc2Formats); formatNdx++)
	{
		const string	formatStr	= de::toString(getFormatStr(etc2Formats[formatNdx].format));
		const string	nameBase	= de::toLower(formatStr.substr(10));

		Compressed2DTestParameters	testParameters;
		testParameters.format		= etc2Formats[formatNdx].format;
		testParameters.width		= sizes[sizeNdx].width;
		testParameters.height		= sizes[sizeNdx].height;
		testParameters.minFilter	= tcu::Sampler::NEAREST;
		testParameters.magFilter	= tcu::Sampler::NEAREST;
		testParameters.programs.push_back(PROGRAM_2D_FLOAT);

		compressedTextureTests->addChild(new TextureTestCase<Compressed2DTestInstance>(testCtx, (nameBase + "_2d_" + sizes[sizeNdx].name).c_str(), (formatStr + ", TEXTURETYPE_2D").c_str(), testParameters));
	}
}